

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber
          (ONX_Model *this,uint managed_font_serial_number,double model_space_text_scale,
          bool bIgnoreSystemDimStyles)

{
  bool bVar1;
  ONX_ModelComponentList *pOVar2;
  byte in_CL;
  uint managed_font_sn;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  ONX_Model *this_00;
  ON_ModelComponentReference OVar4;
  ONX_ModelComponentReferenceLink *local_38;
  ONX_ModelComponentReferenceLink *link;
  bool bIgnoreSystemDimStyles_local;
  double model_space_text_scale_local;
  uint managed_font_serial_number_local;
  ONX_Model *this_local;
  
  this_00 = (ONX_Model *)CONCAT44(in_register_00000034,managed_font_serial_number);
  managed_font_sn = (uint)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles);
  bVar1 = Internal_DimStyleHasFont
                    (&this_00->m_default_dimension_style,managed_font_sn,model_space_text_scale,
                     (bool)(in_CL & 1));
  if (bVar1) {
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&this_00->m_default_dimension_style);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pOVar2 = Internal_ComponentListConst(this_00,DimStyle);
    for (local_38 = pOVar2->m_first_mcr_link; local_38 != (ONX_ModelComponentReferenceLink *)0x0;
        local_38 = local_38->m_next) {
      bVar1 = Internal_DimStyleHasFont
                        (&local_38->m_mcr,managed_font_sn,model_space_text_scale,(bool)(in_CL & 1));
      if (bVar1) {
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&local_38->m_mcr);
        _Var3._M_pi = extraout_RDX_00;
        goto LAB_005f60e6;
      }
    }
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var3._M_pi = extraout_RDX_01;
  }
LAB_005f60e6:
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber(
  unsigned int managed_font_serial_number,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
) const
{
  if (Internal_DimStyleHasFont(m_default_dimension_style, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
    return m_default_dimension_style;

  for (
    ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    if (Internal_DimStyleHasFont(link->m_mcr, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
      return link->m_mcr;
  }

  return ON_ModelComponentReference::Empty;
}